

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

bool qUnregisterResourceData(int version,uchar *tree,uchar *name,uchar *data)

{
  bool bVar1;
  ResourceList *this;
  qsizetype qVar2;
  const_reference ppQVar3;
  QResourceRoot *pQVar4;
  int in_EDI;
  long in_FS_OFFSET;
  QResourceRoot *root;
  int i;
  ResourceList *list;
  QResourceRoot res;
  scoped_lock<QRecursiveMutex> locker;
  QRecursiveMutex *in_stack_ffffffffffffff38;
  QList<(anonymous_namespace)::QResourceRoot_*> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  QResourceRoot *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  int version_00;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  int local_74;
  bool local_39;
  undefined1 local_38 [40];
  undefined1 *local_10;
  long local_8;
  
  version_00 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>::
          isDestroyed((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                       *)0x2e8151);
  if (bVar1) {
    local_39 = false;
  }
  else {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    resourceMutex();
    (anonymous_namespace)::qt_scoped_lock<QRecursiveMutex,std::scoped_lock<QRecursiveMutex>>
              (in_stack_ffffffffffffff38);
    if ((in_EDI < 1) || (3 < in_EDI)) {
      local_39 = false;
    }
    else {
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      anon_unknown.dwarf_3b8fd3::QResourceRoot::QResourceRoot
                ((QResourceRoot *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 version_00,(uchar *)in_stack_ffffffffffffff50,
                 (uchar *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 (uchar *)in_stack_ffffffffffffff40);
      this = resourceList();
      local_74 = 0;
      while (qVar2 = QList<(anonymous_namespace)::QResourceRoot_*>::size(this), local_74 < qVar2) {
        ppQVar3 = QList<(anonymous_namespace)::QResourceRoot_*>::at
                            (in_stack_ffffffffffffff40,(qsizetype)in_stack_ffffffffffffff38);
        bVar1 = anon_unknown.dwarf_3b8fd3::QResourceRoot::operator==
                          (*ppQVar3,(QResourceRoot *)local_38);
        if (bVar1) {
          pQVar4 = QList<(anonymous_namespace)::QResourceRoot_*>::takeAt
                             ((QList<(anonymous_namespace)::QResourceRoot_*> *)
                              in_stack_ffffffffffffff50,
                              CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
          bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x2e82ce);
          if ((!bVar1) && (in_stack_ffffffffffffff50 = pQVar4, pQVar4 != (QResourceRoot *)0x0)) {
            (*pQVar4->_vptr_QResourceRoot[1])();
            in_stack_ffffffffffffff50 = pQVar4;
          }
        }
        else {
          local_74 = local_74 + 1;
        }
      }
      local_39 = true;
      anon_unknown.dwarf_3b8fd3::QResourceRoot::~QResourceRoot((QResourceRoot *)local_38);
    }
    std::scoped_lock<QRecursiveMutex>::~scoped_lock((scoped_lock<QRecursiveMutex> *)0x2e8372);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

Q_CORE_EXPORT bool qUnregisterResourceData(int version, const unsigned char *tree,
                                           const unsigned char *name, const unsigned char *data)
{
    if (resourceGlobalData.isDestroyed())
        return false;

    const auto locker = qt_scoped_lock(resourceMutex());
    if (version >= 0x01 && version <= 0x3) {
        QResourceRoot res(version, tree, name, data);
        ResourceList *list = resourceList();
        for (int i = 0; i < list->size();) {
            if (*list->at(i) == res) {
                QResourceRoot *root = list->takeAt(i);
                if (!root->ref.deref())
                    delete root;
            } else {
                ++i;
            }
        }
        return true;
    }
    return false;
}